

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O3

Bytes __thiscall
Omega_h::prevent_coarsen_flip2_dim<3>
          (Omega_h *this,Mesh *mesh,Bytes *sides_matter,Bytes *verts_matter,Reals *vert_normals,
          LOs *cands2edges,Bytes *cand_codes,Real epsilon)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  Mesh *pMVar4;
  undefined8 uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  LO size_in;
  size_t sVar9;
  Bytes BVar10;
  Write<signed_char> out;
  Reals coords;
  LOs sv2v;
  LOs ev2v;
  type f;
  Adj v2s;
  Write<signed_char> local_1b0;
  Alloc *local_1a0;
  void *local_198;
  Write<signed_char> local_190;
  Alloc *local_180;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  element_type *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  Mesh *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  Read<signed_char> local_138;
  type local_128;
  Adj local_60;
  
  local_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)epsilon;
  if ((uint)mesh->dim_ < 4) {
    if (mesh->dim_ == 3) {
      Mesh::ask_verts_of((Mesh *)&local_160,(Int)mesh);
      Mesh::ask_verts_of((Mesh *)&local_170,(Int)mesh);
      Mesh::ask_up(&local_60,mesh,0,2);
      Mesh::coords((Mesh *)&local_180);
      pAVar3 = (cands2edges->write_).shared_alloc_.alloc;
      if (((ulong)pAVar3 & 1) == 0) {
        sVar9 = pAVar3->size;
      }
      else {
        sVar9 = (ulong)pAVar3 >> 3;
      }
      local_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verts_matter;
      local_148 = mesh;
      local_128.cands2edges.write_.shared_alloc_.alloc = (Alloc *)&local_128.cand_codes;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
      size_in = (LO)(sVar9 >> 2);
      Write<signed_char>::Write(&local_1b0,size_in,(string *)&local_128);
      if (local_128.cands2edges.write_.shared_alloc_.alloc != (Alloc *)&local_128.cand_codes) {
        operator_delete(local_128.cands2edges.write_.shared_alloc_.alloc,
                        (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                         *)&(local_128.cand_codes.write_.shared_alloc_.alloc)->size)
                                       ->_M_ptr + 1));
      }
      pMVar4 = local_148;
      local_128.cands2edges.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
      if (((ulong)local_128.cands2edges.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.cands2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.cands2edges.write_.shared_alloc_.alloc =
               (Alloc *)((local_128.cands2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_128.cands2edges.write_.shared_alloc_.alloc)->use_count =
               (local_128.cands2edges.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_128.cands2edges.write_.shared_alloc_.direct_ptr =
           (cands2edges->write_).shared_alloc_.direct_ptr;
      local_128.cand_codes.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
      if (((ulong)local_128.cand_codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.cand_codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.cand_codes.write_.shared_alloc_.alloc =
               (Alloc *)((local_128.cand_codes.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_128.cand_codes.write_.shared_alloc_.alloc)->use_count =
               (local_128.cand_codes.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_128.cand_codes.write_.shared_alloc_.direct_ptr =
           (cand_codes->write_).shared_alloc_.direct_ptr;
      local_128.ev2v.write_.shared_alloc_.alloc = (Alloc *)local_160._M_pi;
      if (((ulong)local_160._M_pi & 7) == 0 && (Alloc *)local_160._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.ev2v.write_.shared_alloc_.alloc =
               (Alloc *)((long)(local_160._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&local_160._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&local_160._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_128.ev2v.write_.shared_alloc_.direct_ptr = local_158;
      local_128.verts_matter.write_.shared_alloc_.alloc =
           (((Write<signed_char> *)&(local_150._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc
      ;
      if (((ulong)local_128.verts_matter.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.verts_matter.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.verts_matter.write_.shared_alloc_.alloc =
               (Alloc *)((local_128.verts_matter.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_128.verts_matter.write_.shared_alloc_.alloc)->use_count =
               (local_128.verts_matter.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_128.verts_matter.write_.shared_alloc_.direct_ptr =
           *(void **)&(local_150._M_pi)->_M_use_count;
      local_128.v2s.super_Graph.a2ab.write_.shared_alloc_.alloc =
           local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
      if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.v2s.super_Graph.a2ab.write_.shared_alloc_.alloc =
               (Alloc *)((long)(((Graph *)
                                &(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size)->a2ab
                               ).write_.shared_alloc_.alloc * 8 + 1);
        }
        else {
          (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
               (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_128.v2s.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
           local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
      local_128.v2s.super_Graph.ab2b.write_.shared_alloc_.alloc =
           local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
      if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.v2s.super_Graph.ab2b.write_.shared_alloc_.alloc =
               (Alloc *)((long)(((Graph *)
                                &(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size)->a2ab
                               ).write_.shared_alloc_.alloc * 8 + 1);
        }
        else {
          (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
               (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_128.v2s.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
           local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
      local_128.v2s.codes.write_.shared_alloc_.alloc = local_60.codes.write_.shared_alloc_.alloc;
      if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.v2s.codes.write_.shared_alloc_.alloc =
               (Alloc *)((long)(((Graph *)&(local_60.codes.write_.shared_alloc_.alloc)->size)->a2ab)
                               .write_.shared_alloc_.alloc * 8 + 1);
        }
        else {
          (local_60.codes.write_.shared_alloc_.alloc)->use_count =
               (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_128.v2s.codes.write_.shared_alloc_.direct_ptr =
           local_60.codes.write_.shared_alloc_.direct_ptr;
      local_128.sides_matter.write_.shared_alloc_.alloc = (sides_matter->write_).shared_alloc_.alloc
      ;
      if (((ulong)local_128.sides_matter.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.sides_matter.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.sides_matter.write_.shared_alloc_.alloc =
               (Alloc *)((local_128.sides_matter.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_128.sides_matter.write_.shared_alloc_.alloc)->use_count =
               (local_128.sides_matter.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_128.sides_matter.write_.shared_alloc_.direct_ptr =
           (sides_matter->write_).shared_alloc_.direct_ptr;
      local_128.sv2v.write_.shared_alloc_.alloc = (Alloc *)local_170._M_pi;
      if (((ulong)local_170._M_pi & 7) == 0 && (Alloc *)local_170._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.sv2v.write_.shared_alloc_.alloc =
               (Alloc *)((long)(local_170._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&local_170._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&local_170._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_128.sv2v.write_.shared_alloc_.direct_ptr = local_168;
      local_128.coords.write_.shared_alloc_.alloc = local_180;
      if (((ulong)local_180 & 7) == 0 && local_180 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.coords.write_.shared_alloc_.alloc = (Alloc *)(local_180->size * 8 + 1);
        }
        else {
          local_180->use_count = local_180->use_count + 1;
        }
      }
      local_128.coords.write_.shared_alloc_.direct_ptr = local_178;
      local_128.vert_normals.write_.shared_alloc_.alloc = (vert_normals->write_).shared_alloc_.alloc
      ;
      if (((ulong)local_128.vert_normals.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.vert_normals.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.vert_normals.write_.shared_alloc_.alloc =
               (Alloc *)((local_128.vert_normals.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_128.vert_normals.write_.shared_alloc_.alloc)->use_count =
               (local_128.vert_normals.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_128.vert_normals.write_.shared_alloc_.direct_ptr =
           (vert_normals->write_).shared_alloc_.direct_ptr;
      local_128.epsilon = (Real)local_140;
      local_128.out.shared_alloc_.alloc = local_1b0.shared_alloc_.alloc;
      if (((ulong)local_1b0.shared_alloc_.alloc & 7) == 0 &&
          local_1b0.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128.out.shared_alloc_.alloc =
               (Alloc *)((local_1b0.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_1b0.shared_alloc_.alloc)->use_count =
               (local_1b0.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_128.out.shared_alloc_.direct_ptr = local_1b0.shared_alloc_.direct_ptr;
      parallel_for<Omega_h::prevent_coarsen_flip2_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<signed_char>,double)::_lambda(int)_1_>
                (size_in,&local_128,"prevent_coarsen_flip");
      local_190.shared_alloc_.alloc = local_1b0.shared_alloc_.alloc;
      if (((ulong)local_1b0.shared_alloc_.alloc & 7) == 0 &&
          local_1b0.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_190.shared_alloc_.alloc = (Alloc *)((local_1b0.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_1b0.shared_alloc_.alloc)->use_count =
               (local_1b0.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_190.shared_alloc_.direct_ptr = local_1b0.shared_alloc_.direct_ptr;
      Read<signed_char>::Read(&local_138,&local_190);
      local_1a0 = (cands2edges->write_).shared_alloc_.alloc;
      if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1a0 = (Alloc *)(local_1a0->size * 8 + 1);
        }
        else {
          local_1a0->use_count = local_1a0->use_count + 1;
        }
      }
      local_198 = (cands2edges->write_).shared_alloc_.direct_ptr;
      Mesh::sync_subset_array<signed_char>
                ((Mesh *)this,(Int)pMVar4,(Read<signed_char> *)0x1,(LOs *)&local_138,
                 (char)&local_1a0,0);
      pAVar3 = local_1a0;
      if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
        piVar1 = &local_1a0->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_1a0);
          operator_delete(pAVar3,0x48);
        }
      }
      if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
          local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_138.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
          operator_delete(local_138.write_.shared_alloc_.alloc,0x48);
        }
      }
      pAVar3 = local_190.shared_alloc_.alloc;
      if (((ulong)local_190.shared_alloc_.alloc & 7) == 0 &&
          local_190.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_190.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_190.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      prevent_coarsen_flip2_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<signed_char>,double)
      ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_128);
      if (((ulong)local_1b0.shared_alloc_.alloc & 7) == 0 &&
          local_1b0.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_1b0.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_1b0.shared_alloc_.alloc);
          operator_delete(local_1b0.shared_alloc_.alloc,0x48);
        }
      }
      if (((ulong)local_180 & 7) == 0 && local_180 != (Alloc *)0x0) {
        piVar1 = &local_180->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_180);
          operator_delete(local_180,0x48);
        }
      }
      Adj::~Adj(&local_60);
      pvVar6 = extraout_RDX;
      if (((ulong)local_170._M_pi & 7) == 0 && (Alloc *)local_170._M_pi != (Alloc *)0x0) {
        p_Var2 = local_170._M_pi + 3;
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_170._M_pi);
          operator_delete(local_170._M_pi,0x48);
          pvVar6 = extraout_RDX_00;
        }
      }
      if (((ulong)local_160._M_pi & 7) == 0 && (Alloc *)local_160._M_pi != (Alloc *)0x0) {
        p_Var2 = local_160._M_pi + 3;
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_160._M_pi);
          operator_delete(local_160._M_pi,0x48);
          pvVar6 = extraout_RDX_01;
        }
      }
      BVar10.write_.shared_alloc_.direct_ptr = pvVar6;
      BVar10.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Bytes)BVar10.write_.shared_alloc_;
    }
    pcVar8 = "mesh->dim() == dim";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_flip.cpp"
    ;
    uVar5 = 0x4a;
  }
  else {
    pcVar8 = "0 <= dim_ && dim_ <= 3";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar5 = 0x33;
  }
  fail("assertion %s failed at %s +%d\n",pcVar8,pcVar7,uVar5);
}

Assistant:

Bytes prevent_coarsen_flip2_dim(Mesh* mesh,
    Bytes sides_matter,  // exposed sides adjacent to candidate vertices
    Bytes verts_matter,  // vertices adjacent to sides that matter
    Reals vert_normals, LOs cands2edges, Bytes cand_codes,
    Real epsilon = OMEGA_H_EPSILON) {  // below this value a dot product is
                                       // considered negative
  OMEGA_H_CHECK(mesh->dim() == dim);
  constexpr auto side_dim = dim - 1;
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto sv2v = mesh->ask_verts_of(side_dim);
  auto v2s = mesh->ask_up(VERT, side_dim);
  auto coords = mesh->coords();
  auto ncands = cands2edges.size();
  auto out = Write<Byte>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = cands2edges[cand];
    auto code = cand_codes[cand];
    for (Int eev_col = 0; eev_col < 2; ++eev_col) {
      if (!collapses(code, eev_col)) continue;
      auto v_col = ev2v[e * 2 + eev_col];
      if (!verts_matter[v_col]) continue;
      auto eev_onto = 1 - eev_col;
      auto v_onto = ev2v[e * 2 + eev_onto];
      for (auto vs = v2s.a2ab[v_col]; vs < v2s.a2ab[v_col + 1]; ++vs) {
        auto s = v2s.ab2b[vs];
        if (!sides_matter[s]) continue;
        auto vs_code = v2s.codes[vs];
        auto ssv_col = code_which_down(vs_code);
        auto ssv2v = gather_verts<side_dim + 1>(sv2v, s);
        Int ssv;
        for (ssv = 0; ssv < side_dim + 1; ++ssv) {
          if (ssv2v[ssv] == v_onto) break;  // ignore sides that will disappear
        }
        if (ssv != side_dim + 1)
          continue;               // ignore sides that will disappear (part 2)
        ssv2v[ssv_col] = v_onto;  // simulate the edge collapse on this side
        auto ssv2x = gather_vectors<side_dim + 1, dim>(coords, ssv2v);
        auto sn = get_side_vector(ssv2x);  // get its new normal
        // compare the new side normal with the old normals of its vertices
        auto ssv2n = gather_vectors<side_dim + 1, dim>(vert_normals, ssv2v);
        for (ssv = 0; ssv < side_dim + 1; ++ssv) {
          if (ssv2n[ssv] * sn < epsilon) break;
        }
        if (ssv < side_dim + 1) {  // got a violator here
          code = dont_collapse(code, eev_col);
        }
      }
    }
    out[cand] = code;
  };
  parallel_for(ncands, f, "prevent_coarsen_flip");
  return mesh->sync_subset_array(
      EDGE, Bytes(out), cands2edges, I8(DONT_COLLAPSE), 1);
}